

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

int NGA_Locate64(int g_a,int64_t *subscript)

{
  int iVar1;
  long lVar2;
  logical lVar3;
  Integer owner;
  Integer _ga_lo [7];
  Integer local_50 [8];
  
  lVar2 = pnga_ndim((long)g_a);
  if (0 < lVar2) {
    do {
      local_50[lVar2] = *subscript + 1;
      subscript = subscript + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  lVar3 = pnga_locate((long)g_a,local_50 + 1,local_50);
  iVar1 = -1;
  if (lVar3 == 1) {
    iVar1 = (int)local_50[0];
  }
  return iVar1;
}

Assistant:

int NGA_Locate64(int g_a, int64_t subscript[])
{
    logical st;
    Integer a=(Integer)g_a, owner;
    Integer ndim = wnga_ndim(a);
    Integer _ga_lo[MAXDIM];
    COPYINDEX_C2F(subscript,_ga_lo,ndim);

    st = wnga_locate(a,_ga_lo,&owner);
    if(st == TRUE) return (int)owner;
    else return -1;
}